

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O2

double __thiscall DataSet::biased(DataSet *this)

{
  pointer pdVar1;
  undefined8 uVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  Matrix<double> *this_00;
  uint index;
  uint j;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = min(this);
  dVar5 = 1.0 - dVar5;
  dVar6 = 0.0;
  if (1.0 <= dVar5) {
    uVar2._0_4_ = (this->m_matrix).m_shape.n_row;
    uVar2._4_4_ = (this->m_matrix).m_shape.n_col;
    this_00 = &this->m_matrix;
    for (index = 0; dVar6 = dVar5, index < (uint)uVar2; index = index + 1) {
      for (uVar4 = 0; uVar4 < (int)((ulong)uVar2 >> 0x20) - 1; uVar4 = uVar4 + 1) {
        pvVar3 = Matrix<double>::operator[](this_00,index);
        pdVar1 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar1[uVar4] = pdVar1[uVar4] + dVar5;
        uVar2._0_4_ = (this_00->m_shape).n_row;
        uVar2._4_4_ = (this_00->m_shape).n_col;
      }
    }
  }
  return dVar6;
}

Assistant:

double DataSet::biased(){
    double bias=-1*min(*this)+1;

    if(bias<1) return 0.;

    for(unsigned i=0;i<m_matrix.shape().n_row;++i){
        for(unsigned j=0;j<m_matrix.shape().n_col-1;++j)
            m_matrix[i][j]+=bias;
    }
    return bias;
}